

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O1

void __thiscall H264StreamReader::~H264StreamReader(H264StreamReader *this)

{
  SPSUnit *this_00;
  _Base_ptr p_Var1;
  pointer puVar2;
  uint8_t *puVar3;
  _Rb_tree_node_base *p_Var4;
  
  for (p_Var4 = (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_spsMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    this_00 = (SPSUnit *)p_Var4[1]._M_parent;
    if (this_00 != (SPSUnit *)0x0) {
      SPSUnit::~SPSUnit(this_00);
      operator_delete(this_00,0x200);
    }
  }
  for (p_Var4 = (this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    p_Var1 = p_Var4[1]._M_parent;
    if (p_Var1 != (_Base_ptr)0x0) {
      *(undefined ***)p_Var1 = &PTR__NALUnit_00242058;
      if (p_Var1->_M_left != (_Base_ptr)0x0) {
        operator_delete__(p_Var1->_M_left);
      }
      operator_delete(p_Var1,0x58);
    }
  }
  puVar2 = (this->m_decodedSliceHeader).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_decodedSliceHeader).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  puVar2 = (this->m_bdRomMetaDataMsg).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_bdRomMetaDataMsg).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  puVar2 = (this->m_lastSeiMvcHeader).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_lastSeiMvcHeader).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&(this->updatedSPSList)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_PPSUnit_*>,_std::_Select1st<std::pair<const_unsigned_int,_PPSUnit_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
  ::~_Rb_tree(&(this->m_ppsMap)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_SPSUnit_*>,_std::_Select1st<std::pair<const_unsigned_int,_SPSUnit_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
  ::~_Rb_tree(&(this->m_spsMap)._M_t);
  (this->super_MPEGStreamReader).super_AbstractStreamReader.super_BaseAbstractStreamReader.
  _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__MPEGStreamReader_00241d88;
  puVar3 = (this->super_MPEGStreamReader).m_tmpBuffer;
  if (puVar3 == (uint8_t *)0x0) {
    return;
  }
  operator_delete__(puVar3);
  return;
}

Assistant:

H264StreamReader::~H264StreamReader()
{
    for (const auto &[index, sps] : m_spsMap) delete sps;
    for (const auto &[index, pps] : m_ppsMap) delete pps;
}